

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

int __thiscall jpgd::jpeg_decoder::decode_next_mcu_row(jpeg_decoder *this)

{
  int iVar1;
  bool bVar2;
  bool chroma_y_filtering;
  jpeg_decoder *this_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)this);
  if (iVar1 == 0) {
    bVar2 = false;
    if (((this->m_flags & 1) == 0) && (bVar2 = true, this->m_scan_type != 4)) {
      bVar2 = this->m_scan_type == 3;
    }
    if (bVar2) {
      std::swap<unsigned_char*>(&this->m_pSample_buf,&this->m_pSample_buf_prev);
      this->m_sample_buf_prev_valid = true;
    }
    if (this->m_progressive_flag == 0) {
      decode_next_row(this);
    }
    else {
      load_next_row(this);
    }
    if (this->m_total_lines_left <= this->m_max_mcu_y_size) {
      find_eoi(this);
    }
    this->m_mcu_lines_left = this->m_max_mcu_y_size;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int jpeg_decoder::decode_next_mcu_row()
	{
		if (::setjmp(m_jmp_state))
			return JPGD_FAILED;

		const bool chroma_y_filtering = ((m_flags & cFlagBoxChromaFiltering) == 0) && ((m_scan_type == JPGD_YH2V2) || (m_scan_type == JPGD_YH1V2));
		if (chroma_y_filtering)
		{
			std::swap(m_pSample_buf, m_pSample_buf_prev);

			m_sample_buf_prev_valid = true;
		}

		if (m_progressive_flag)
			load_next_row();
		else
			decode_next_row();

		// Find the EOI marker if that was the last row.
		if (m_total_lines_left <= m_max_mcu_y_size)
			find_eoi();

		m_mcu_lines_left = m_max_mcu_y_size;
		return 0;
	}